

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_abstractsingleroleserialiser.cpp
# Opt level: O0

void AbstractSingleRoleSerialiser::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  int *piVar1;
  int iVar2;
  void *_v_1;
  AbstractSingleRoleSerialiser *_t_1;
  void *_v;
  AbstractSingleRoleSerialiser *_t;
  void **_a_local;
  int _id_local;
  Call _c_local;
  QObject *_o_local;
  
  if (_c == ReadProperty) {
    piVar1 = (int *)*_a;
    if (_id == 0) {
      iVar2 = roleToSave((AbstractSingleRoleSerialiser *)_o);
      *piVar1 = iVar2;
    }
  }
  else if ((_c == WriteProperty) && (_id == 0)) {
    setRoleToSave((AbstractSingleRoleSerialiser *)_o,**_a);
  }
  return;
}

Assistant:

void AbstractSingleRoleSerialiser::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{

#ifndef QT_NO_PROPERTIES
    if (_c == QMetaObject::ReadProperty) {
        auto *_t = static_cast<AbstractSingleRoleSerialiser *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast< int*>(_v) = _t->roleToSave(); break;
        default: break;
        }
    } else if (_c == QMetaObject::WriteProperty) {
        auto *_t = static_cast<AbstractSingleRoleSerialiser *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setRoleToSave(*reinterpret_cast< int*>(_v)); break;
        default: break;
        }
    } else if (_c == QMetaObject::ResetProperty) {
    } else if (_c == QMetaObject::BindableProperty) {
    }
#endif // QT_NO_PROPERTIES
    (void)_o;
    (void)_id;
    (void)_c;
    (void)_a;
}